

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianPreInt
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long startCol;
  uint v;
  long lVar12;
  ulong row;
  ulong col;
  undefined1 auVar13 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  Matrix<double,__1,__1,_0,__1,__1> K2;
  ChMatrixNM<double,_1,_NSF> tempRow1;
  ChMatrixNM<double,_1,_NSF> tempRow0;
  ChMatrixNM<double,_1,_NSF> tempRow2;
  Matrix3xN temp;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  Matrix<double,__1,__1,_0,__1,__1> MStack_15d50;
  double dStack_15d38;
  Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false> BStack_15d30;
  Matrix<double,_1,_32,_1,_1,_32> MStack_15d00;
  Matrix<double,_1,_32,_1,_1,_32> MStack_15c00;
  Matrix<double,_1,_32,_1,_1,_32> MStack_15b00;
  PlainObjectBase<Eigen::Matrix<double,3,32,1,3,32>> aPStack_15a00 [768];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  aCStack_15700 [88];
  Matrix<double,_3,_32,_1,_3,_32> MStack_14680;
  Product<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_Eigen::Matrix<double,_1,_32,_1,_1,_32>,_0>
  aPStack_14380 [146];
  StorageBaseType aSStack_12380 [768];
  Matrix<double,_9,_1024,_0,_9,_1024> MStack_12080;
  
  dStack_15d38 = Mfactor;
  CalcCoordMatrix(this,(Matrix3xN *)&MStack_14680);
  CalcCoordDerivMatrix(this,(Matrix3xN *)aSStack_12380);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = Kfactor;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = Rfactor;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_Alpha;
  auVar13 = vfmadd132sd_fma(auVar14,auVar3,auVar13);
  MStack_15c00.super_PlainObjectBase<Eigen::Matrix<double,_1,_32,_1,_1,_32>_>.m_storage.m_data.array
  [0] = auVar13._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>
                    *)aPStack_14380,(double *)&MStack_15c00,(StorageBaseType *)&MStack_14680);
  MStack_15d00.super_PlainObjectBase<Eigen::Matrix<double,_1,_32,_1,_1,_32>_>.m_storage.m_data.array
  [0] = Kfactor * this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>
                    *)aCStack_15700,(double *)&MStack_15d00,aSStack_12380);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,32,1,3,32>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,32,1,3,32>const>const,Eigen::Matrix<double,3,32,1,3,32>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,32,1,3,32>const>const,Eigen::Matrix<double,3,32,1,3,32>const>const>>
            (aPStack_15a00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_const_Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>_>
              *)&MStack_12080);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,1,32,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>> *)&MStack_15c00,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_1,_32,_false>_> *)
             &MStack_12080);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,1,32,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>> *)&MStack_15d00,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_1,_32,_false>_> *)
             &MStack_12080);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,1,32,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,32,1,1,32>> *)&MStack_15b00,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_1,_32,_false>_> *)
             &MStack_12080);
  lVar10 = 0;
  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
    Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false> *)aCStack_15700,
               &MStack_14680,0,lVar12);
    aPStack_14380[0].m_rhs = &MStack_15c00;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)aCStack_15700[0].m_rhs;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_outerStride =
         aCStack_15700[0]._40_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>.m_data =
         (PointerType)aCStack_15700[0]._0_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>._8_8_ =
         aCStack_15700[0].m_lhs.m_rows.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)aCStack_15700[0].m_lhs.m_cols.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)aCStack_15700[0].m_lhs.m_functor.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false>::Block
              (&BStack_15d30,&MStack_12080,0,lVar10);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,1024,0,9,1024>,3,32,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,3,1,false>,Eigen::Matrix<double,1,32,1,1,32>,0>>
              (&BStack_15d30,aPStack_14380);
    Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false> *)aCStack_15700,
               &MStack_14680,0,lVar12);
    aPStack_14380[0].m_rhs = &MStack_15d00;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)aCStack_15700[0].m_rhs;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_outerStride =
         aCStack_15700[0]._40_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>.m_data =
         (PointerType)aCStack_15700[0]._0_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>._8_8_ =
         aCStack_15700[0].m_lhs.m_rows.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)aCStack_15700[0].m_lhs.m_cols.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)aCStack_15700[0].m_lhs.m_functor.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false>::Block
              (&BStack_15d30,&MStack_12080,3,lVar10);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,1024,0,9,1024>,3,32,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,3,1,false>,Eigen::Matrix<double,1,32,1,1,32>,0>>
              (&BStack_15d30,aPStack_14380);
    Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false> *)aCStack_15700,
               &MStack_14680,0,lVar12);
    aPStack_14380[0].m_rhs = &MStack_15b00;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startCol.
    m_value = (long)aCStack_15700[0].m_rhs;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_outerStride =
         aCStack_15700[0]._40_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>.m_data =
         (PointerType)aCStack_15700[0]._0_8_;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false>,_0>._8_8_ =
         aCStack_15700[0].m_lhs.m_rows.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_xpr =
         (XprTypeNested)aCStack_15700[0].m_lhs.m_cols.m_value;
    aPStack_14380[0].m_lhs.
    super_BlockImpl<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_3,_1,_false,_true>.m_startRow.
    m_value = (long)aCStack_15700[0].m_lhs.m_functor.m_other;
    Eigen::Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false>::Block
              (&BStack_15d30,&MStack_12080,6,lVar10);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,1024,0,9,1024>,3,32,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,32,1,3,32>,3,1,false>,Eigen::Matrix<double,1,32,1,1,32>,0>>
              (&BStack_15d30,aPStack_14380);
    lVar10 = lVar10 + 0x20;
  }
  aCStack_15700[0]._0_8_ = &MStack_12080;
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
             *)aPStack_14380,(Lhs *)aCStack_15700,&this->m_O2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,1024,0,9,1024>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&MStack_15d50,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)aPStack_14380);
  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
    lVar11 = lVar10 * 3;
    startCol = lVar10;
    for (lVar12 = 2; lVar12 != 0x62; lVar12 = lVar12 + 3) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380,
                 &MStack_15d50,0,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)aCStack_15700,H,lVar11,lVar12 + -2);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)aCStack_15700,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380,
                 &MStack_15d50,3,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)aCStack_15700,H,lVar11,lVar12 + -1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)aCStack_15700,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380,
                 &MStack_15d50,6,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)aCStack_15700,H,lVar11,lVar12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)aCStack_15700,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)aPStack_14380);
      startCol = startCol + 0x20;
    }
  }
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = Kfactor;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar4,auVar2);
  BStack_15d30.
  super_BlockImpl<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_1024,_0,_9,_1024>,_3,_32,_false>,_0>.m_data =
       (PointerType)vmovlpd_avx(auVar13);
  Eigen::operator*(aCStack_15700,(double *)&BStack_15d30,(StorageBaseType *)&this->m_K13Compact);
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>> *)aPStack_14380,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)aCStack_15700);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                    *)&BStack_15d30,&dStack_15d38,(StorageBaseType *)&this->m_MassMatrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,528,1,0,528,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,528,1,0,528,1>const>const,Eigen::Matrix<double,528,1,0,528,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,528,1,0,528,1>> *)aCStack_15700,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>,_const_Eigen::Matrix<double,_528,_1,_0,_528,_1>_>_>
              *)&BStack_15d30);
  lVar10 = -0xffffffc2;
  uVar9 = 0;
  for (row = 0; row != 0x20; row = row + 1) {
    lVar12 = 2;
    col = 0;
    lVar11 = 0x20;
    while (lVar11 != 0) {
      if (col < row) {
        uVar5 = ((int)lVar11 * ((int)col + -0x1f) + 0x3e0U >> 1) + (int)row;
      }
      else {
        uVar5 = ((uint)(uVar9 >> 1) & 0x7fffffff) + (int)col;
      }
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1> *)
                          aCStack_15700,(ulong)uVar5);
      dVar1 = *pSVar6;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1> *)
                          aPStack_14380,row,col);
      dVar1 = dVar1 + *pSVar7;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3,lVar12 + -2);
      *pSVar8 = dVar1 + *pSVar8;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3 + 1,lVar12 + -1);
      *pSVar8 = dVar1 + *pSVar8;
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,row * 3 + 2,lVar12);
      col = col + 1;
      lVar12 = lVar12 + 3;
      *pSVar8 = dVar1 + *pSVar8;
      lVar11 = lVar11 + -1;
    }
    uVar9 = uVar9 + lVar10;
    lVar10 = lVar10 + -2;
  }
  Eigen::internal::handmade_aligned_free
            (MStack_15d50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_data);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  For this method, the in-simulation calculations are
    // independent of the number of Gauss quadrature points used throughout the entire element.  Since computationally
    // expensive quantities are required for both the generalized internal force vector and its Jacobian, these values
    // were cached for reuse during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}